

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::AggregationValidatorProcessor::process_validateTrace
          (AggregationValidatorProcessor *this,int32_t seqid,TProtocol *iprot,TProtocol *oprot,
          void *callContext)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *__nbytes;
  size_t __n;
  void *__buf;
  void *__buf_00;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [24];
  string local_198;
  undefined4 local_174;
  TApplicationException x;
  exception *e;
  AggregationValidator_validateTrace_result result;
  undefined1 local_88 [4];
  uint32_t bytes;
  AggregationValidator_validateTrace_args args;
  undefined1 local_50 [8];
  TProcessorContextFreer freer;
  void *ctx;
  void *callContext_local;
  TProtocol *oprot_local;
  TProtocol *iprot_local;
  int32_t seqid_local;
  AggregationValidatorProcessor *this_local;
  
  freer.method_ = (char *)0x0;
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    freer.method_ =
         (char *)(**(code **)(*(long *)peVar3 + 0x10))
                           (peVar3,"AggregationValidator.validateTrace",callContext);
  }
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  __nbytes = "AggregationValidator.validateTrace";
  apache::thrift::TProcessorContextFreer::TProcessorContextFreer
            ((TProcessorContextFreer *)local_50,peVar2,freer.method_,
             "AggregationValidator.validateTrace");
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    (**(code **)(*(long *)peVar3 + 0x20))(peVar3,freer.method_,"AggregationValidator.validateTrace")
    ;
  }
  AggregationValidator_validateTrace_args::AggregationValidator_validateTrace_args
            ((AggregationValidator_validateTrace_args *)local_88);
  AggregationValidator_validateTrace_args::read
            ((AggregationValidator_validateTrace_args *)local_88,(int)iprot,__buf,(size_t)__nbytes);
  apache::thrift::protocol::TProtocol::readMessageEnd(iprot);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)&result.__isset);
  peVar4 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&result.__isset);
  iVar1 = (*peVar4->_vptr_TTransport[8])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)&result.__isset);
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    (**(code **)(*(long *)peVar3 + 0x28))
              (peVar3,freer.method_,"AggregationValidator.validateTrace",iVar1);
  }
  AggregationValidator_validateTrace_result::AggregationValidator_validateTrace_result
            ((AggregationValidator_validateTrace_result *)&e);
  peVar5 = std::
           __shared_ptr_access<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->iface_);
  (**(code **)(*(long *)peVar5 + 0x10))(peVar5,&result,&args);
  result.success.traceCount._0_1_ = (byte)result.success.traceCount & 0xfe | 1;
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    (**(code **)(*(long *)peVar3 + 0x30))(peVar3,freer.method_,"AggregationValidator.validateTrace")
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"validateTrace",(allocator *)(local_1b0 + 0x17))
  ;
  __n = (size_t)(uint)seqid;
  apache::thrift::protocol::TProtocol::writeMessageBegin(oprot,&local_198,T_REPLY,seqid);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)(local_1b0 + 0x17));
  AggregationValidator_validateTrace_result::write
            ((AggregationValidator_validateTrace_result *)&e,(int)oprot,__buf_00,__n);
  apache::thrift::protocol::TProtocol::writeMessageEnd(oprot);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_1b0);
  peVar4 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1b0);
  iVar1 = (*peVar4->_vptr_TTransport[10])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_1b0);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_1c0);
  peVar4 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1c0);
  (*peVar4->_vptr_TTransport[0xb])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_1c0);
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    (**(code **)(*(long *)peVar3 + 0x38))
              (peVar3,freer.method_,"AggregationValidator.validateTrace",iVar1);
  }
  local_174 = 0;
  AggregationValidator_validateTrace_result::~AggregationValidator_validateTrace_result
            ((AggregationValidator_validateTrace_result *)&e);
  AggregationValidator_validateTrace_args::~AggregationValidator_validateTrace_args
            ((AggregationValidator_validateTrace_args *)local_88);
  apache::thrift::TProcessorContextFreer::~TProcessorContextFreer
            ((TProcessorContextFreer *)local_50);
  return;
}

Assistant:

void AggregationValidatorProcessor::process_validateTrace(int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot, void* callContext)
{
  void* ctx = NULL;
  if (this->eventHandler_.get() != NULL) {
    ctx = this->eventHandler_->getContext("AggregationValidator.validateTrace", callContext);
  }
  ::apache::thrift::TProcessorContextFreer freer(this->eventHandler_.get(), ctx, "AggregationValidator.validateTrace");

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preRead(ctx, "AggregationValidator.validateTrace");
  }

  AggregationValidator_validateTrace_args args;
  args.read(iprot);
  iprot->readMessageEnd();
  uint32_t bytes = iprot->getTransport()->readEnd();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postRead(ctx, "AggregationValidator.validateTrace", bytes);
  }

  AggregationValidator_validateTrace_result result;
  try {
    iface_->validateTrace(result.success, args.traceId);
    result.__isset.success = true;
  } catch (const std::exception& e) {
    if (this->eventHandler_.get() != NULL) {
      this->eventHandler_->handlerError(ctx, "AggregationValidator.validateTrace");
    }

    ::apache::thrift::TApplicationException x(e.what());
    oprot->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_EXCEPTION, seqid);
    x.write(oprot);
    oprot->writeMessageEnd();
    oprot->getTransport()->writeEnd();
    oprot->getTransport()->flush();
    return;
  }

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preWrite(ctx, "AggregationValidator.validateTrace");
  }

  oprot->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_REPLY, seqid);
  result.write(oprot);
  oprot->writeMessageEnd();
  bytes = oprot->getTransport()->writeEnd();
  oprot->getTransport()->flush();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postWrite(ctx, "AggregationValidator.validateTrace", bytes);
  }
}